

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
::lexer(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
        *this,iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
              *adapter,bool ignore_comments_)

{
  char cVar1;
  int_type iVar2;
  byte in_DL;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  *(byte *)(in_RDI + 2) = in_DL & 1;
  iVar2 = std::char_traits<char>::eof();
  *(int_type *)((long)in_RDI + 0x14) = iVar2;
  *(undefined1 *)(in_RDI + 3) = 0;
  memset((position_t *)(in_RDI + 4),0,0x18);
  position_t::position_t((position_t *)(in_RDI + 4));
  memset(in_RDI + 7,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x9b1401);
  std::__cxx11::string::string((string *)(in_RDI + 10));
  in_RDI[0xe] = "";
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  cVar1 = get_decimal_point();
  *(int *)(in_RDI + 0x12) = (int)cVar1;
  return;
}

Assistant:

explicit lexer(InputAdapterType&& adapter, bool ignore_comments_ = false) noexcept
        : ia(std::move(adapter))
        , ignore_comments(ignore_comments_)
        , decimal_point_char(static_cast<char_int_type>(get_decimal_point()))
    {}